

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Writer::InitParameters(BP3Writer *this)

{
  string *in_stack_000002c0;
  size_t in_stack_000002c8;
  BPBase *in_stack_000002d0;
  string *in_stack_00000ca8;
  string *in_stack_00000cb0;
  Params *in_stack_00000cb8;
  BPBase *in_stack_00000cc0;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"in call to BP3::Open for writing",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  adios2::format::BPBase::Init
            (in_stack_00000cc0,in_stack_00000cb8,in_stack_00000cb0,in_stack_00000ca8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"in call to BP3::Open to write",&local_89);
  adios2::format::BPBase::ResizeBuffer(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}